

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

void share_setup_x11_channel
               (ssh_sharing_connstate *cs,share_channel *chan,uint upstream_id,uint server_id,
               uint server_currwin,uint server_maxpkt,uint client_adjusted_window,char *peer_addr,
               int peer_port,int endian,int protomajor,int protominor,void *initial_data,
               int initial_len)

{
  strbuf *psVar1;
  strbuf *packet;
  void *pvStack_38;
  int greeting_len;
  void *greeting;
  share_xchannel *xc;
  uint server_maxpkt_local;
  uint server_currwin_local;
  uint server_id_local;
  uint upstream_id_local;
  share_channel *chan_local;
  ssh_sharing_connstate *cs_local;
  
  xc._0_4_ = server_maxpkt;
  xc._4_4_ = server_currwin;
  server_maxpkt_local = server_id;
  server_currwin_local = upstream_id;
  _server_id_local = chan;
  chan_local = (share_channel *)cs;
  greeting = share_add_xchannel(cs,upstream_id,server_id);
  pvStack_38 = x11_make_greeting(endian,protomajor,protominor,_server_id_local->x11_auth_proto,
                                 _server_id_local->x11_auth_data,_server_id_local->x11_auth_datalen,
                                 peer_addr,peer_port,(int *)((long)&packet + 4));
  psVar1 = strbuf_new_nm();
  BinarySink_put_uint32(psVar1->binarysink_,0);
  BinarySink_put_uint32(psVar1->binarysink_,(long)(packet._4_4_ + initial_len));
  BinarySink_put_data(psVar1->binarysink_,pvStack_38,(long)packet._4_4_);
  BinarySink_put_data(psVar1->binarysink_,initial_data,(long)initial_len);
  safefree(pvStack_38);
  share_xchannel_add_message((share_xchannel *)greeting,0x5e,psVar1->s,(int)psVar1->len);
  strbuf_free(psVar1);
  *(uint *)((long)greeting + 0xc) = client_adjusted_window + packet._4_4_;
  psVar1 = strbuf_new();
  BinarySink_put_stringz(psVar1->binarysink_,"x11");
  BinarySink_put_uint32(psVar1->binarysink_,(ulong)server_maxpkt_local);
  BinarySink_put_uint32(psVar1->binarysink_,(ulong)xc._4_4_);
  BinarySink_put_uint32(psVar1->binarysink_,(ulong)(uint)xc);
  BinarySink_put_stringz(psVar1->binarysink_,peer_addr);
  BinarySink_put_uint32(psVar1->binarysink_,(long)peer_port);
  send_packet_to_downstream
            ((ssh_sharing_connstate *)chan_local,0x5a,psVar1->s,(int)psVar1->len,
             (share_channel *)0x0);
  strbuf_free(psVar1);
  if ((_server_id_local->x11_one_shot & 1U) != 0) {
    ssh_remove_sharing_x11_display
              (*(ConnectionLayer **)(*(long *)&chan_local->state + 0x20),
               _server_id_local->x11_auth_upstream);
    _server_id_local->x11_auth_upstream = (X11FakeAuth *)0x0;
    safefree(_server_id_local->x11_auth_data);
    _server_id_local->x11_auth_proto = -1;
    _server_id_local->x11_auth_datalen = 0;
    _server_id_local->x11_one_shot = false;
  }
  return;
}

Assistant:

void share_setup_x11_channel(ssh_sharing_connstate *cs, share_channel *chan,
                             unsigned upstream_id, unsigned server_id,
                             unsigned server_currwin, unsigned server_maxpkt,
                             unsigned client_adjusted_window,
                             const char *peer_addr, int peer_port, int endian,
                             int protomajor, int protominor,
                             const void *initial_data, int initial_len)
{
    struct share_xchannel *xc;
    void *greeting;
    int greeting_len;
    strbuf *packet;

    /*
     * Create an xchannel containing data we've already received from
     * the X client, and preload it with a CHANNEL_DATA message
     * containing our own made-up authorisation greeting and any
     * additional data sent from the server so far.
     */
    xc = share_add_xchannel(cs, upstream_id, server_id);
    greeting = x11_make_greeting(endian, protomajor, protominor,
                                 chan->x11_auth_proto,
                                 chan->x11_auth_data, chan->x11_auth_datalen,
                                 peer_addr, peer_port, &greeting_len);
    packet = strbuf_new_nm();
    put_uint32(packet, 0); /* leave the channel id field unfilled - we
                            * don't know the downstream id yet */
    put_uint32(packet, greeting_len + initial_len);
    put_data(packet, greeting, greeting_len);
    put_data(packet, initial_data, initial_len);
    sfree(greeting);
    share_xchannel_add_message(xc, SSH2_MSG_CHANNEL_DATA,
                               packet->s, packet->len);
    strbuf_free(packet);

    xc->window = client_adjusted_window + greeting_len;

    /*
     * Send on a CHANNEL_OPEN to downstream.
     */
    packet = strbuf_new();
    put_stringz(packet, "x11");
    put_uint32(packet, server_id);
    put_uint32(packet, server_currwin);
    put_uint32(packet, server_maxpkt);
    put_stringz(packet, peer_addr);
    put_uint32(packet, peer_port);
    send_packet_to_downstream(cs, SSH2_MSG_CHANNEL_OPEN,
                              packet->s, packet->len, NULL);
    strbuf_free(packet);

    /*
     * If this was a once-only X forwarding, clean it up now.
     */
    if (chan->x11_one_shot) {
        ssh_remove_sharing_x11_display(cs->parent->cl,
                                       chan->x11_auth_upstream);
        chan->x11_auth_upstream = NULL;
        sfree(chan->x11_auth_data);
        chan->x11_auth_proto = -1;
        chan->x11_auth_datalen = 0;
        chan->x11_one_shot = false;
    }
}